

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_typed_tests.hpp
# Opt level: O1

bool iutest::detail::
     TypeParameterizedTestSuite<test::TypeParamTest,_iutest::detail::VariadicTemplateTypeList<test::iutest_typed_test_suite_p_name_TypeParamTest_::StaticMul2,_test::iutest_typed_test_suite_p_name_TypeParamTest_::Mul2>,_iutest::detail::VariadicTypeList<short,_char>_>
     ::Register(char *prefix,char *testsuite_name,string *package_name,char *names,char *file,
               int line,size_t index)

{
  bool bVar1;
  
  bVar1 = Register_(prefix,testsuite_name,package_name,names,file,line,index);
  return bVar1;
}

Assistant:

static bool Register(const char* prefix, const char* testsuite_name
        , const ::std::string& package_name, const char* names
        , const char* file, int line
        , size_t index=0)
    {
#if IUTEST_HAS_EXCEPTIONS
        try
        {
            return Register_(prefix, testsuite_name, package_name, names, file, line, index);
        }
        catch (const ::std::exception& e)
        {
            IUTEST_LOG_(FATAL) << "IUTEST_INSTANTIATE_TYPED_TEST_SUITE_P register tests failed... (what: "
                << e.what() << ")\n";
        }
        catch(...)
        {
            IUTEST_LOG_(FATAL) << "IUTEST_INSTANTIATE_TYPED_TEST_SUITE_P register tests failed...\n";
        }
        return false;
#else
        return Register_(prefix, testsuite_name, package_name, names, file, line, index);
#endif
    }